

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,float power,ImGuiDragFlags flags)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiInputSource IVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  uVar9 = data_type & 0xfffffffe;
  if ((((v_min != v_max) || (bVar3 = false, NAN(v_min) || NAN(v_max))) &&
      ((bVar3 = false, power != 1.0 || (NAN(power))))) && (uVar9 == 4)) {
    bVar3 = v_max - v_min < 3.4028234663852886e+38;
  }
  if ((v_speed == 0.0) && (!NAN(v_speed))) {
    if (((v_min != v_max) || (NAN(v_min) || NAN(v_max))) && (v_max - v_min < 3.4028234663852886e+38)
       ) {
      v_speed = (float)((v_max - v_min) * (double)GImGui->DragSpeedDefaultRatio);
    }
  }
  uVar10 = flags & 1;
  IVar7 = GImGui->ActiveIdSource;
  if (IVar7 == ImGuiInputSource_Mouse) {
    bVar6 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar6) || ((pIVar5->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar7 = pIVar5->ActiveIdSource;
      goto LAB_001546e3;
    }
    fVar16 = (pIVar5->IO).NavInputs[(ulong)uVar10 + 0x1d];
    if ((pIVar5->IO).KeyAlt != false) {
      fVar16 = fVar16 * 0.01;
    }
    if ((pIVar5->IO).KeyShift == true) {
      fVar16 = fVar16 * 10.0;
    }
  }
  else {
LAB_001546e3:
    fVar16 = 0.0;
    if (IVar7 == ImGuiInputSource_Nav) {
      uVar8 = 0;
      if (uVar9 == 4) {
        uVar8 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar16 = (&local_38.x)[uVar10];
      if ((int)uVar8 < 0) {
        fVar14 = 1.1754944e-38;
      }
      else if (uVar8 < 10) {
        fVar14 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar8 * 4);
      }
      else {
        fVar14 = powf(10.0,(float)(int)-uVar8);
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar14 <= v_speed) |
                       ~-(uint)(fVar14 <= v_speed) & (uint)fVar14);
    }
  }
  fVar16 = fVar16 * v_speed;
  fVar14 = fVar16;
  if (uVar10 != 0) {
    fVar14 = -fVar16;
  }
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    if ((*v < v_max) || (bVar6 = true, fVar14 <= 0.0)) {
      bVar6 = fVar14 < 0.0 && *v <= v_min;
    }
  }
  else {
    bVar6 = false;
  }
  if (bVar3) {
    if ((fVar14 < 0.0) && (0.0 < pIVar5->DragCurrentAccum)) goto LAB_0015486c;
    if (fVar14 <= 0.0) goto LAB_00154835;
    bVar4 = pIVar5->DragCurrentAccum <= 0.0 && pIVar5->DragCurrentAccum != 0.0;
  }
  else {
LAB_00154835:
    bVar4 = false;
  }
  if (((pIVar5->ActiveIdIsJustActivated & 1U) == 0 && !bVar6) && (!bVar4)) {
    if ((fVar16 != 0.0) || (NAN(fVar16))) {
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum + fVar14;
      pIVar5->DragCurrentAccumDirty = true;
    }
    else if ((pIVar5->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if (bVar3) {
      dVar2 = v_max - v_min;
      dVar1 = pow((*v - v_min) / dVar2,1.0 / (double)power);
      fVar11 = (float)((double)pIVar5->DragCurrentAccum / dVar2 + dVar1);
      fVar16 = 1.0;
      if (fVar11 <= 1.0) {
        fVar16 = fVar11;
      }
      fVar16 = powf((float)(~-(uint)(fVar11 < 0.0) & (uint)fVar16),power);
      dVar15 = RoundScalarWithFormatT<double,double>
                         (format,data_type,(double)fVar16 * dVar2 + v_min);
      pIVar5->DragCurrentAccumDirty = false;
      dVar2 = pow((dVar15 - v_min) / dVar2,1.0 / (double)power);
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - (float)(dVar2 - dVar1);
      uVar12 = SUB84(*v,0);
      uVar13 = (undefined4)((ulong)*v >> 0x20);
    }
    else {
      dVar15 = RoundScalarWithFormatT<double,double>
                         (format,data_type,*v + (double)pIVar5->DragCurrentAccum);
      pIVar5->DragCurrentAccumDirty = false;
      dVar1 = *v;
      uVar12 = SUB84(dVar1,0);
      uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - (float)(dVar15 - dVar1);
    }
    dVar15 = (double)(~-(ulong)(dVar15 == 0.0) & (ulong)dVar15);
    if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
      if (((double)CONCAT44(uVar13,uVar12) != dVar15) ||
         (NAN((double)CONCAT44(uVar13,uVar12)) || NAN(dVar15))) {
        if ((dVar15 < v_min) ||
           (((uVar9 != 4 &&
             ((double)CONCAT44(uVar13,uVar12) <= dVar15 && dVar15 != (double)CONCAT44(uVar13,uVar12)
             )) && (fVar14 < 0.0)))) {
          dVar15 = v_min;
        }
        if ((v_max < dVar15) ||
           (((uVar9 != 4 &&
             (dVar15 <= (double)CONCAT44(uVar13,uVar12) && (double)CONCAT44(uVar13,uVar12) != dVar15
             )) && (0.0 < fVar14)))) {
          dVar15 = v_max;
        }
      }
    }
    if (((double)CONCAT44(uVar13,uVar12) == dVar15) &&
       (!NAN((double)CONCAT44(uVar13,uVar12)) && !NAN(dVar15))) {
      return false;
    }
    *v = dVar15;
    return true;
  }
LAB_0015486c:
  pIVar5->DragCurrentAccum = 0.0;
  pIVar5->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool has_min_max = (v_min != v_max);
    const bool is_power = (power != 1.0f && is_decimal && has_min_max && (v_max - v_min < FLT_MAX));

    // Default tweak speed
    if (v_speed == 0.0f && has_min_max && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = has_min_max && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && has_min_max)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}